

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallmon.cpp
# Opt level: O0

pair<int,_unsigned_long_long> __thiscall
wallmon::get_mother_starttime(wallmon *this,pid_t mother_pid)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  MessageBase *this_00;
  int in_ESI;
  char *pcVar5;
  long in_RDI;
  pair<int,_unsigned_long_long> pVar6;
  stringstream strm;
  ifstream proc_stat;
  stringstream stat_fname;
  unsigned_long_long start_time_clock_t;
  string tmp_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stat_entries;
  string *in_stack_fffffffffffff978;
  string *in_stack_fffffffffffff980;
  value_type *in_stack_fffffffffffff988;
  undefined7 in_stack_fffffffffffff990;
  undefined1 in_stack_fffffffffffff997;
  size_type in_stack_fffffffffffff9a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff9b0;
  int local_600 [2];
  long local_5f8;
  int local_5ec;
  string local_5e8 [32];
  string local_5c8 [32];
  stringstream local_5a8 [16];
  ostream local_598 [376];
  string local_420 [32];
  long local_400 [65];
  stringstream local_1f8 [16];
  ostream local_1e8 [376];
  unsigned_long_long local_70;
  string local_68 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  int local_1c;
  pair<int,_unsigned_long_long> local_10;
  
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c = in_ESI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3577cf);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  std::__cxx11::string::string(local_68);
  std::__cxx11::stringstream::stringstream(local_1f8);
  poVar3 = std::operator<<(local_1e8,"/proc/");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
  poVar3 = std::operator<<(poVar3,"/stat");
  std::ostream::operator<<(poVar3,std::ends<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::ifstream::ifstream(local_400,local_420,_S_in);
  std::__cxx11::string::~string(local_420);
  while( true ) {
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)local_400 + *(long *)(local_400[0] + -0x18)));
    bVar2 = false;
    if (bVar1) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_38);
      bVar2 = sVar4 < 0x16;
    }
    if (!bVar2) break;
    std::operator>>((istream *)local_400,local_68);
    bVar2 = std::ios::operator_cast_to_bool
                      ((ios *)((long)local_400 + *(long *)(local_400[0] + -0x18)));
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                  in_stack_fffffffffffff988);
    }
  }
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_38);
  if (sVar4 < 0x16) {
    std::__cxx11::stringstream::stringstream(local_5a8);
    poVar3 = std::operator<<(local_598,"Read only ");
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_38);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    poVar3 = std::operator<<(poVar3," from mother PID stat file");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(local_598,"Stream status of ");
    std::__cxx11::stringstream::str();
    poVar3 = std::operator<<(poVar3,local_5c8);
    poVar3 = std::operator<<(poVar3," is ");
    in_stack_fffffffffffff997 =
         std::ios::operator_cast_to_bool((ios *)((long)local_400 + *(long *)(local_400[0] + -0x18)))
    ;
    pcVar5 = "bad";
    if ((bool)in_stack_fffffffffffff997) {
      pcVar5 = "good";
    }
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_5c8);
    this_00 = (MessageBase *)(in_RDI + 8);
    std::__cxx11::stringstream::str();
    MessageBase::warning(this_00,in_stack_fffffffffffff978);
    std::__cxx11::string::~string(local_5e8);
    local_5ec = 1;
    local_5f8 = 0;
    std::pair<int,_unsigned_long_long>::pair<int,_long,_true>(&local_10,&local_5ec,&local_5f8);
    local_600[1] = 1;
    std::__cxx11::stringstream::~stringstream(local_5a8);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_38,0x15);
    local_70 = std::__cxx11::stol(in_stack_fffffffffffff980,(size_t *)in_stack_fffffffffffff978,0);
    local_600[0] = 0;
    std::pair<int,_unsigned_long_long>::pair<int,_unsigned_long_long_&,_true>
              (&local_10,local_600,&local_70);
    local_600[1] = 1;
  }
  std::ifstream::~ifstream(local_400);
  std::__cxx11::stringstream::~stringstream(local_1f8);
  std::__cxx11::string::~string(local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
  pVar6._4_4_ = 0;
  pVar6.first = local_10.first;
  pVar6.second = local_10.second;
  return pVar6;
}

Assistant:

std::pair<int, unsigned long long> wallmon::get_mother_starttime(
    pid_t mother_pid) {
  std::vector<std::string> stat_entries{};
  stat_entries.reserve(52);
  std::string tmp_str{};
  unsigned long long start_time_clock_t;

  std::stringstream stat_fname{};
  stat_fname << "/proc/" << mother_pid << "/stat" << std::ends;
  std::ifstream proc_stat{stat_fname.str()};
  while (proc_stat && stat_entries.size() < prmon::uptime_pos + 1) {
    proc_stat >> tmp_str;
    if (proc_stat) stat_entries.push_back(tmp_str);
  }
  if (stat_entries.size() > prmon::uptime_pos) {
    start_time_clock_t = std::stol(stat_entries[prmon::uptime_pos]);
  } else {
    // Some error happened!
    std::stringstream strm;
    strm << "Read only " << stat_entries.size() << " from mother PID stat file"
         << std::endl;
    strm << "Stream status of " << stat_fname.str() << " is "
         << (proc_stat ? "good" : "bad") << std::endl;
    warning(strm.str());
    return std::pair<int, unsigned long long>{1, 0L};
  }
  return std::pair<int, unsigned long long>{0, start_time_clock_t};
}